

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondStamp.cpp
# Opt level: O2

void __thiscall OpenMD::BondStamp::validate(BondStamp *this)

{
  double dVar1;
  pointer pcVar2;
  string local_58 [32];
  undefined8 local_38 [4];
  
  DataHolder::validate(&this->super_DataHolder);
  if ((this->BondOrder).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->BondOrder).data_;
    std::__cxx11::string::~string((string *)local_38);
    if (dVar1 <= 0.0) {
      pcVar2 = (this->BondOrder).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)local_38,local_58);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,local_38[0]);
      std::__cxx11::string::~string((string *)local_38);
      std::__cxx11::string::~string(local_58);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void BondStamp::validate() {
    DataHolder::validate();
    CheckParameter(BondOrder, isPositive());
  }